

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smoke_test.cxx
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int gid__;
  Master *pMVar3;
  function<bool_(int,_const_diy::Master_&)> *this;
  void *b_00;
  void *pvVar4;
  reference pvVar5;
  _Base_ptr l;
  _Base_ptr p_Var6;
  uint j;
  Block *b;
  BlockID neighbor;
  Link *link;
  int gid;
  uint i;
  vector<int,_std::allocator<int>_> gids;
  RoundRobinAssigner assigner;
  Master master;
  FileStorage storage;
  Options ops;
  bool help;
  string prefix;
  int in_memory;
  int threads;
  int nblocks;
  communicator world;
  environment env;
  unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *in_stack_ffffffffffffe358;
  BlockID *block;
  Master *in_stack_ffffffffffffe360;
  _func_void_void_ptr_BinaryBuffer_ptr **in_stack_ffffffffffffe368;
  NeverSkip *__f;
  function<void_(void_*,_diy::BinaryBuffer_&)> *in_stack_ffffffffffffe370;
  undefined8 in_stack_ffffffffffffe378;
  string *in_stack_ffffffffffffe380;
  undefined4 in_stack_ffffffffffffe388;
  undefined4 in_stack_ffffffffffffe38c;
  string *in_stack_ffffffffffffe390;
  allocator<char> *__a;
  _func_void_Block_ptr_ProxyWithLink_ptr **in_stack_ffffffffffffe398;
  allocator<char> *paVar7;
  Master *in_stack_ffffffffffffe3a0;
  Options *in_stack_ffffffffffffe3a8;
  ostream *out;
  FileStorage *in_stack_ffffffffffffe3b0;
  FileStorage *this_00;
  string *in_stack_ffffffffffffe3b8;
  undefined4 in_stack_ffffffffffffe3c0;
  undefined4 in_stack_ffffffffffffe3c4;
  string *in_stack_ffffffffffffe3c8;
  string *in_stack_ffffffffffffe3d0;
  undefined4 in_stack_ffffffffffffe3dc;
  char s;
  undefined4 uVar8;
  undefined4 uVar9;
  MemoryManagement *mem;
  undefined1 remote;
  allocator<char> local_1b89;
  string local_1b88 [32];
  allocator<char> local_1b68 [111];
  allocator<char> local_1af9;
  string local_1af8 [72];
  code *local_1ab0;
  undefined8 local_1aa8;
  undefined8 uStack_1aa0;
  undefined8 local_1a98;
  undefined8 uStack_1a90;
  undefined8 local_1a88;
  undefined8 uStack_1a80;
  undefined8 local_1a78;
  undefined8 uStack_1a70;
  undefined8 local_1a68;
  undefined8 uStack_1a60;
  undefined8 local_1a58;
  undefined8 uStack_1a50;
  undefined1 local_1a40 [40];
  _Rb_tree_color local_1a18;
  uint local_1a14;
  _Base_ptr local_1a10;
  int local_1a08;
  int local_1a04;
  _Base_ptr local_1a00;
  value_type local_19f8;
  uint local_19f4;
  vector<int,_std::allocator<int>_> local_19f0;
  code *local_19c8;
  NeverSkip local_19c0 [32];
  code *local_19a0;
  code *local_1978;
  code *local_1950;
  SaveBlock *in_stack_ffffffffffffe6c0;
  undefined8 in_stack_ffffffffffffe6c8;
  undefined8 in_stack_ffffffffffffe6d0;
  DIY_MPI_Comm in_stack_ffffffffffffe6d8;
  string *in_stack_ffffffffffffe6e0;
  _Base_ptr in_stack_ffffffffffffe820;
  int in_stack_ffffffffffffe82c;
  Options *in_stack_ffffffffffffe830;
  BlockID local_2e0 [16];
  undefined4 local_260;
  allocator<char> local_259;
  string local_258 [39];
  allocator<char> local_231;
  string local_230 [47];
  allocator<char> local_201;
  string local_200 [39];
  allocator<char> local_1d9;
  string local_1d8 [47];
  allocator<char> local_1a9;
  string local_1a8 [39];
  allocator<char> local_181;
  string local_180 [47];
  undefined1 local_151 [40];
  allocator<char> local_129;
  string local_128 [47];
  allocator<char> local_f9;
  string local_f8 [39];
  allocator<char> local_d1;
  string local_d0 [102];
  byte local_6a;
  allocator<char> local_69;
  string local_68 [32];
  undefined4 local_48;
  undefined4 local_44;
  int local_40;
  communicator local_30;
  int local_4;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffe378 >> 0x20);
  s = (char)((uint)in_stack_ffffffffffffe3dc >> 0x18);
  local_4 = 0;
  diy::mpi::environment::environment
            ((environment *)in_stack_ffffffffffffe360,
             (int)((ulong)in_stack_ffffffffffffe358 >> 0x20),(char **)0x1103fd);
  diy::mpi::communicator::communicator((communicator *)in_stack_ffffffffffffe360);
  local_40 = 0x80;
  local_44 = 4;
  local_48 = 8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe3a0,(char *)in_stack_ffffffffffffe398,
             (allocator<char> *)in_stack_ffffffffffffe390);
  std::allocator<char>::~allocator(&local_69);
  opts::Options::Options((Options *)in_stack_ffffffffffffe360);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe3a0,(char *)in_stack_ffffffffffffe398,
             (allocator<char> *)in_stack_ffffffffffffe390);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe3a0,(char *)in_stack_ffffffffffffe398,
             (allocator<char> *)in_stack_ffffffffffffe390);
  opts::Option<int>(s,in_stack_ffffffffffffe3d0,(int *)in_stack_ffffffffffffe3c8,
                    (string *)CONCAT44(in_stack_ffffffffffffe3c4,in_stack_ffffffffffffe3c0));
  pMVar3 = (Master *)
           opts::Options::operator>>((Options *)in_stack_ffffffffffffe360,in_stack_ffffffffffffe358)
  ;
  paVar7 = &local_129;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe3a0,(char *)in_stack_ffffffffffffe398,
             (allocator<char> *)in_stack_ffffffffffffe390);
  mem = (MemoryManagement *)local_151;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe3a0,(char *)in_stack_ffffffffffffe398,
             (allocator<char> *)in_stack_ffffffffffffe390);
  opts::Option<int>(s,in_stack_ffffffffffffe3d0,(int *)in_stack_ffffffffffffe3c8,
                    (string *)CONCAT44(in_stack_ffffffffffffe3c4,in_stack_ffffffffffffe3c0));
  opts::Options::operator>>((Options *)in_stack_ffffffffffffe360,in_stack_ffffffffffffe358);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe3a0,(char *)in_stack_ffffffffffffe398,
             (allocator<char> *)in_stack_ffffffffffffe390);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe3a0,(char *)in_stack_ffffffffffffe398,
             (allocator<char> *)in_stack_ffffffffffffe390);
  opts::Option<int>(s,in_stack_ffffffffffffe3d0,(int *)in_stack_ffffffffffffe3c8,
                    (string *)CONCAT44(in_stack_ffffffffffffe3c4,in_stack_ffffffffffffe3c0));
  opts::Options::operator>>((Options *)in_stack_ffffffffffffe360,in_stack_ffffffffffffe358);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe3a0,(char *)in_stack_ffffffffffffe398,
             (allocator<char> *)in_stack_ffffffffffffe390);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe3a0,(char *)in_stack_ffffffffffffe398,
             (allocator<char> *)in_stack_ffffffffffffe390);
  opts::Option<std::__cxx11::string>
            (in_stack_ffffffffffffe3c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe3c4,in_stack_ffffffffffffe3c0),in_stack_ffffffffffffe3b8
            );
  opts::Options::operator>>((Options *)in_stack_ffffffffffffe360,in_stack_ffffffffffffe358);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe3a0,(char *)in_stack_ffffffffffffe398,
             (allocator<char> *)in_stack_ffffffffffffe390);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe3a0,(char *)in_stack_ffffffffffffe398,
             (allocator<char> *)in_stack_ffffffffffffe390);
  opts::Option<bool>((char)((ulong)in_stack_ffffffffffffe398 >> 0x38),in_stack_ffffffffffffe390,
                     (bool *)CONCAT44(in_stack_ffffffffffffe38c,in_stack_ffffffffffffe388),
                     in_stack_ffffffffffffe380);
  opts::Options::operator>>((Options *)in_stack_ffffffffffffe360,in_stack_ffffffffffffe358);
  std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::~unique_ptr
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffe360);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator(&local_259);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator(&local_231);
  std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::~unique_ptr
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffe360);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator(&local_201);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::~unique_ptr
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffe360);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator(&local_181);
  std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::~unique_ptr
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffe360);
  std::__cxx11::string::~string((string *)(local_151 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_151);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::~unique_ptr
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffe360);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  bVar1 = opts::Options::parse
                    (in_stack_ffffffffffffe830,in_stack_ffffffffffffe82c,
                     (char **)in_stack_ffffffffffffe820);
  if ((bVar1) && ((local_6a & 1) == 0)) {
    diy::FileStorage::FileStorage(in_stack_ffffffffffffe3b0,(string *)in_stack_ffffffffffffe3a8);
    diy::mpi::communicator::communicator((communicator *)&stack0xffffffffffffe6d8,&local_30);
    local_1950 = create_block;
    uVar8 = local_44;
    uVar9 = local_48;
    std::function<void*()>::function<void*(*)(),void>
              ((function<void_*()> *)in_stack_ffffffffffffe370,
               (_func_void_ptr **)in_stack_ffffffffffffe368);
    local_1978 = destroy_block;
    std::function<void(void*)>::function<void(*)(void*),void>
              ((function<void_(void_*)> *)in_stack_ffffffffffffe370,
               (_func_void_void_ptr **)in_stack_ffffffffffffe368);
    local_19a0 = save_block;
    std::function<void(void_const*,diy::BinaryBuffer&)>::
    function<void(*)(void_const*,diy::BinaryBuffer&),void>
              ((function<void_(const_void_*,_diy::BinaryBuffer_&)> *)in_stack_ffffffffffffe370,
               in_stack_ffffffffffffe368);
    local_19c8 = load_block;
    std::function<void(void*,diy::BinaryBuffer&)>::function<void(*)(void*,diy::BinaryBuffer&),void>
              (in_stack_ffffffffffffe370,in_stack_ffffffffffffe368);
    this = (function<bool_(int,_const_diy::Master_&)> *)operator_new(0x10);
    diy::Master::QueueSizePolicy::QueueSizePolicy
              ((QueueSizePolicy *)in_stack_ffffffffffffe360,(size_t)in_stack_ffffffffffffe358);
    __f = local_19c0;
    in_stack_ffffffffffffe360 = (Master *)&stack0xffffffffffffe668;
    block = local_2e0;
    diy::Master::Master((Master *)master.mt_gen._M_x[0xb8],(communicator *)master.mt_gen._M_x[0xb7],
                        master.mt_gen._M_x[0xb6]._4_4_,(int)master.mt_gen._M_x[0xb6],
                        (CreateBlock *)master.mt_gen._M_x[0xb5],
                        (DestroyBlock *)master.mt_gen._M_x[0xb4],
                        (ExternalStorage *)master.mt_gen._M_x[0xba],
                        (SaveBlock *)master.mt_gen._M_x[0xbb],(LoadBlock *)master.mt_gen._M_x[0xbc],
                        (QueuePolicy *)master.mt_gen._M_x[0xbd]);
    std::function<void_(void_*,_diy::BinaryBuffer_&)>::~function
              ((function<void_(void_*,_diy::BinaryBuffer_&)> *)0x110edc);
    std::function<void_(const_void_*,_diy::BinaryBuffer_&)>::~function
              ((function<void_(const_void_*,_diy::BinaryBuffer_&)> *)0x110ee9);
    std::function<void_(void_*)>::~function((function<void_(void_*)> *)0x110ef6);
    std::function<void_*()>::~function((function<void_*()> *)0x110f03);
    diy::mpi::communicator::~communicator((communicator *)0x110f10);
    gid__ = diy::mpi::communicator::size(&local_30);
    diy::RoundRobinAssigner::Assigner
              ((RoundRobinAssigner *)in_stack_ffffffffffffe360,(int)((ulong)block >> 0x20),
               (int)block);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x110f50);
    diy::mpi::communicator::rank(&local_30);
    diy::RoundRobinAssigner::local_gids
              ((RoundRobinAssigner *)in_stack_ffffffffffffe380,iVar2,
               (vector<int,_std::allocator<int>_> *)this);
    local_19f4 = 0;
    while( true ) {
      b_00 = (void *)(ulong)local_19f4;
      pvVar4 = (void *)std::vector<int,_std::allocator<int>_>::size(&local_19f0);
      remote = (undefined1)((ulong)paVar7 >> 0x38);
      if (pvVar4 <= b_00) break;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_19f0,(ulong)local_19f4);
      local_19f8 = *pvVar5;
      l = (_Base_ptr)operator_new(0x20);
      diy::Link::Link((Link *)in_stack_ffffffffffffe360);
      local_1a00 = l;
      if (local_19f8 < local_40 + -1) {
        local_1a08 = local_19f8 + 1;
        local_1a04 = diy::RoundRobinAssigner::rank
                               ((RoundRobinAssigner *)in_stack_ffffffffffffe360,
                                (int)((ulong)block >> 0x20));
        diy::Link::add_neighbor((Link *)in_stack_ffffffffffffe360,block);
      }
      if (0 < local_19f8) {
        local_1a08 = local_19f8 + -1;
        local_1a04 = diy::RoundRobinAssigner::rank
                               ((RoundRobinAssigner *)in_stack_ffffffffffffe360,
                                (int)((ulong)block >> 0x20));
        diy::Link::add_neighbor((Link *)in_stack_ffffffffffffe360,block);
      }
      p_Var6 = (_Base_ptr)operator_new(0x20);
      Block::Block((Block *)0x1111aa);
      local_1a10 = p_Var6;
      for (local_1a14 = 0; local_1a14 < 3; local_1a14 = local_1a14 + 1) {
        local_1a18 = local_19f8 * 3 + local_1a14;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe360,&block->gid);
      }
      diy::Master::add((Master *)CONCAT44(uVar9,uVar8),gid__,b_00,(Link *)l);
      local_19f4 = local_19f4 + 1;
    }
    local_1a40._32_8_ = local_sum;
    this_00 = (FileStorage *)local_1a40;
    std::function<bool(int,diy::Master_const&)>::function<diy::Master::NeverSkip,void>(this,__f);
    diy::Master::foreach<void(*)(Block*,diy::Master::ProxyWithLink_const&)>
              (in_stack_ffffffffffffe3a0,in_stack_ffffffffffffe398,(Skip *)in_stack_ffffffffffffe390
              );
    std::function<bool_(int,_const_diy::Master_&)>::~function
              ((function<bool_(int,_const_diy::Master_&)> *)0x1112a4);
    local_1a58 = 0;
    uStack_1a50 = 0;
    local_1a68 = 0;
    uStack_1a60 = 0;
    local_1a78 = 0;
    uStack_1a70 = 0;
    local_1a88 = 0;
    uStack_1a80 = 0;
    local_1a98 = 0;
    uStack_1a90 = 0;
    local_1aa8 = 0;
    uStack_1aa0 = 0;
    out = (ostream *)&local_1aa8;
    diy::MemoryManagement::MemoryManagement((MemoryManagement *)in_stack_ffffffffffffe360);
    diy::Master::exchange(pMVar3,(bool)remote,mem);
    diy::MemoryManagement::~MemoryManagement((MemoryManagement *)in_stack_ffffffffffffe360);
    local_1ab0 = average_neighbors;
    pMVar3 = (Master *)(local_1af8 + 0x28);
    std::function<bool(int,diy::Master_const&)>::function<diy::Master::NeverSkip,void>(this,__f);
    diy::Master::foreach<void(*)(Block*,diy::Master::ProxyWithLink_const&)>
              (pMVar3,in_stack_ffffffffffffe398,(Skip *)in_stack_ffffffffffffe390);
    std::function<bool_(int,_const_diy::Master_&)>::~function
              ((function<bool_(int,_const_diy::Master_&)> *)0x11135e);
    paVar7 = &local_1af9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pMVar3,
               (char *)paVar7,(allocator<char> *)in_stack_ffffffffffffe390);
    diy::MemoryBuffer::MemoryBuffer((MemoryBuffer *)in_stack_ffffffffffffe360,(size_t)block);
    __a = local_1b68;
    std::function<void_(const_void_*,_diy::BinaryBuffer_&)>::function
              ((function<void_(const_void_*,_diy::BinaryBuffer_&)> *)in_stack_ffffffffffffe360,block
              );
    diy::io::write_blocks
              (in_stack_ffffffffffffe6e0,(communicator *)in_stack_ffffffffffffe6d8.data,
               (Master *)in_stack_ffffffffffffe6d0,(MemoryBuffer *)in_stack_ffffffffffffe6c8,
               in_stack_ffffffffffffe6c0);
    std::function<void_(const_void_*,_diy::BinaryBuffer_&)>::~function
              ((function<void_(const_void_*,_diy::BinaryBuffer_&)> *)0x1113ed);
    diy::MemoryBuffer::~MemoryBuffer((MemoryBuffer *)in_stack_ffffffffffffe360);
    std::__cxx11::string::~string(local_1af8);
    std::allocator<char>::~allocator(&local_1af9);
    iVar2 = diy::mpi::communicator::rank(&local_30);
    if (iVar2 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pMVar3,
                 (char *)paVar7,__a);
      diy::stats::Profiler::output((Profiler *)this_00,out,(string *)pMVar3);
      std::__cxx11::string::~string(local_1b88);
      std::allocator<char>::~allocator(&local_1b89);
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
    diy::RoundRobinAssigner::~RoundRobinAssigner((RoundRobinAssigner *)0x1115f6);
    diy::Master::~Master(in_stack_ffffffffffffe360);
    diy::FileStorage::~FileStorage(this_00);
    local_260 = 0;
  }
  else {
    iVar2 = diy::mpi::communicator::rank(&local_30);
    if (iVar2 == 0) {
      opts::operator<<((ostream *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3a8);
    }
    local_4 = 1;
    local_260 = 1;
  }
  opts::Options::~Options((Options *)in_stack_ffffffffffffe360);
  std::__cxx11::string::~string(local_68);
  diy::mpi::communicator::~communicator((communicator *)0x111642);
  diy::mpi::environment::~environment((environment *)0x11164f);
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
    diy::mpi::environment     env(argc, argv); // equivalent of MPI_Init(argc, argv)/MPI_Finalize()
    diy::mpi::communicator    world;           // equivalent of MPI_COMM_WORLD

    int                       nblocks   = 128; // global number of blocks
    int                       threads   = 4;   // allow diy 4 threads for multithreading blocks
    int                       in_memory = 8;   // allow diy to keep 8 local blocks in memory
    std::string               prefix    = "./DIY.XXXXXX"; // prefix for temp files for blocks
                                                          // moved out of core

    bool help;

    // get command line arguments
    using namespace opts;
    Options ops;
    ops
        >> Option('b', "blocks",  nblocks,        "number of blocks")
        >> Option('t', "thread",  threads,        "number of threads")
        >> Option('m', "memory",  in_memory,      "maximum blocks to store in memory")
        >> Option(     "prefix",  prefix,         "prefix for external storage")
        >> Option('h', "help",    help,           "show help")
        ;
    if (!ops.parse(argc,argv) || help)
    {
        if (world.rank() == 0)
            std::cout << ops;
        return 1;
    }

    // diy initialization
    diy::FileStorage          storage(prefix); // used for blocks to be moved out of core
    diy::Master               master(world,    // master is the diy top-level object
                                     threads,
                                     in_memory,
                                     &create_block,
                                     &destroy_block,
                                     &storage,
                                     &save_block,
                                     &load_block);

    // choice of contiguous or round robin assigner
    // diy::ContiguousAssigner   assigner(world.size(), nblocks);
    diy::RoundRobinAssigner   assigner(world.size(), nblocks);

    // this example creates a linear chain of blocks
    std::vector<int> gids;                     // global ids of local blocks
    assigner.local_gids(world.rank(), gids);   // get the gids of local blocks
    for (unsigned i = 0; i < gids.size(); ++i) // for the local blocks in this processor
    {
        int gid = gids[i];

        diy::Link*    link = new diy::Link;  // link is this block's neighborhood
        diy::BlockID  neighbor;
        if (gid < nblocks - 1)               // all but the last block in the global domain
        {
            neighbor.gid  = gid + 1;                     // gid of the neighbor block
            neighbor.proc = assigner.rank(neighbor.gid); // process of the neighbor block
            link->add_neighbor(neighbor);                // add the neighbor block to the link
        }
        if (gid > 0)                         // all but the first block in the global domain
        {
            neighbor.gid  = gid - 1;
            neighbor.proc = assigner.rank(neighbor.gid);
            link->add_neighbor(neighbor);
        }

        Block* b = new Block;                // create a new block
        // assign some values for the block
        // in this example, simply based on the block global id
        for (unsigned j = 0; j < 3; ++j)
            b->values.push_back(gid * 3 + j);

        master.add(gid, b, link);            // add the current local block to the master
    }

    // compute, exchange, compute
    master.foreach(&local_sum);          // callback function executed on each local block
    master.exchange();                   // exchange data between blocks in the link
    master.foreach(&average_neighbors);  // callback function executed on each local block

    // save the results in diy format
    diy::io::write_blocks("blocks.out", world, master);

    if (world.rank() == 0)
        master.prof.output(std::cout);
}